

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_ObjSetGateLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsBuf(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsMux(p,pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsXor(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsAnd(pObj);
        if (iVar1 != 0) {
          Gia_ObjSetAndLevel(p,pObj);
        }
      }
      else {
        Gia_ObjSetXorLevel(p,pObj);
      }
    }
    else {
      Gia_ObjSetMuxLevel(p,pObj);
    }
  }
  else {
    Gia_ObjSetBufLevel(p,pObj);
  }
  return;
}

Assistant:

static inline void         Gia_ObjSetGateLevel( Gia_Man_t * p, Gia_Obj_t * pObj ){ if ( Gia_ObjIsBuf(pObj) ) Gia_ObjSetBufLevel(p, pObj); else if ( Gia_ObjIsMux(p,pObj) ) Gia_ObjSetMuxLevel(p, pObj); else if ( Gia_ObjIsXor(pObj) ) Gia_ObjSetXorLevel(p, pObj); else if ( Gia_ObjIsAnd(pObj) ) Gia_ObjSetAndLevel(p, pObj); }